

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void * __thiscall
anon_unknown.dwarf_426d84::BumpPointerAllocator::allocateMassive
          (BumpPointerAllocator *this,size_t NBytes)

{
  BlockMeta *pBVar1;
  BlockMeta *NewMeta;
  size_t NBytes_local;
  BumpPointerAllocator *this_local;
  
  pBVar1 = (BlockMeta *)malloc(NBytes + 0x10);
  if (pBVar1 == (BlockMeta *)0x0) {
    std::terminate();
  }
  pBVar1->Next = this->BlockList->Next;
  pBVar1->Current = 0;
  this->BlockList->Next = pBVar1;
  return pBVar1 + 1;
}

Assistant:

void* allocateMassive(size_t NBytes) {
    NBytes += sizeof(BlockMeta);
    BlockMeta* NewMeta = reinterpret_cast<BlockMeta*>(std::malloc(NBytes));
    if (NewMeta == nullptr)
      std::terminate();
    BlockList->Next = new (NewMeta) BlockMeta{BlockList->Next, 0};
    return static_cast<void*>(NewMeta + 1);
  }